

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_infix(gravity_parser_t *parser)

{
  gtoken_t token;
  gnode_t *lnode_00;
  _Bool _Var1;
  gnode_t *rnode_00;
  gnode_t *local_68;
  prec_level local_44;
  gnode_t *rnode;
  prec_level precedence;
  grammar_rule *rule;
  gnode_t *lnode;
  gtoken_t tok;
  gravity_parser_t *parser_local;
  
  token = parser->current_token;
  lnode_00 = parser->current_node;
  if ((rules[token].right & 1U) == 0) {
    local_44 = rules[token].precedence;
  }
  else {
    local_44 = rules[token].precedence + ~PREC_LOWEST;
  }
  rnode_00 = parse_precedence(parser,local_44);
  if ((token == TOK_OP_ASSIGN) || (_Var1 = token_isassignment(token), !_Var1)) {
    if (parser->declarations->n == 0) {
      local_68 = (gnode_t *)0x0;
    }
    else {
      local_68 = parser->declarations->p[parser->declarations->n - 1];
    }
    parser_local = (gravity_parser_t *)gnode_binary_expr_create(token,lnode_00,rnode_00,local_68);
  }
  else {
    parser_local = (gravity_parser_t *)adjust_assignment_expression(parser,token,lnode_00,rnode_00);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_infix (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_infix");

    gtoken_t tok = parser->current_token;
    gnode_t *lnode = parser->current_node;

    // we can make right associative operators by reducing the right binding power
    grammar_rule *rule = &rules[tok];
    prec_level precedence = (rule->right) ? rule->precedence-1 : rule->precedence;

    gnode_t *rnode = parse_precedence(parser, precedence);
    if ((tok != TOK_OP_ASSIGN) && token_isassignment(tok)) return adjust_assignment_expression(parser, tok, lnode, rnode);
    return gnode_binary_expr_create(tok, lnode, rnode, LAST_DECLARATION());
}